

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockReceiver.hpp
# Opt level: O3

void __thiscall
Sinclair::ZXSpectrum::Video::Video<(Sinclair::ZXSpectrum::Video::Timing)2>::set_time_since_interrupt
          (Video<(Sinclair::ZXSpectrum::Video::Timing)2> *this,HalfCycles time)

{
  long lVar1;
  long lVar2;
  WrappedInt<HalfCycles> duration;
  
  lVar2 = ((long)time.super_WrappedInt<HalfCycles>.length_ + 0x1b9ba) % 0x229f8;
  lVar1 = (long)this->time_into_frame_;
  if (lVar2 == lVar1) {
    return;
  }
  duration.length_ = ((long)time.super_WrappedInt<HalfCycles>.length_ - lVar1) + 0x229f8;
  if ((long)time.super_WrappedInt<HalfCycles>.length_ - lVar1 != 0 &&
      lVar1 <= (long)time.super_WrappedInt<HalfCycles>.length_) {
    duration.length_ = (lVar2 - time.super_WrappedInt<HalfCycles>.length_).length_;
  }
  run_for(this,(HalfCycles)duration.length_);
  return;
}

Assistant:

forceinline constexpr T operator +(const T &rhs) const			{	return T(length_ + rhs.length_);	}